

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_resize.cpp
# Opt level: O2

void duckdb::ListResizeFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  idx_t count;
  data_ptr_t pdVar1;
  ulong uVar2;
  reference this;
  reference this_00;
  Vector *this_01;
  Vector *target;
  Vector *pVVar3;
  idx_t j;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  idx_t iVar10;
  bool bVar11;
  optional_ptr<duckdb::Vector,_true> default_vector;
  SelectionVector sel;
  UnifiedVectorFormat new_sizes_data;
  UnifiedVectorFormat lists_data;
  UnifiedVectorFormat default_data;
  UnifiedVectorFormat child_data;
  
  if ((result->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  count = args->count;
  UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
  Vector::ToUnifiedFormat(this,count,&lists_data);
  this_01 = ListVector::GetEntry(this);
  UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
  Vector::ToUnifiedFormat(this_01,count,&child_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&new_sizes_data);
  Vector::ToUnifiedFormat(this_00,count,&new_sizes_data);
  iVar5 = 0;
  for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
    iVar7 = iVar8;
    if ((lists_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(lists_data.sel)->sel_vector[iVar8];
    }
    iVar10 = iVar8;
    if ((new_sizes_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar10 = (idx_t)(new_sizes_data.sel)->sel_vector[iVar8];
    }
    if (((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) ||
        ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6]
          >> (iVar7 & 0x3f) & 1) != 0)) &&
       ((new_sizes_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0 ||
        ((new_sizes_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
          [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)))) {
      iVar5 = iVar5 + *(long *)(new_sizes_data.data + iVar10 * 8);
    }
  }
  ListVector::Reserve(result,iVar5);
  ListVector::SetListSize(result,iVar5);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  target = ListVector::GetEntry(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&default_data);
  default_vector.ptr = (Vector *)0x0;
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x138) {
    default_vector.ptr = vector<duckdb::Vector,_true>::get<true>(&args->data,2);
    pVVar3 = optional_ptr<duckdb::Vector,_true>::operator->(&default_vector);
    Vector::ToUnifiedFormat(pVVar3,count,&default_data);
  }
  iVar8 = 0;
  iVar5 = 0;
  do {
    if (iVar8 == count) {
      bVar11 = DataChunk::AllConstant(args);
      if (bVar11) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&default_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&new_sizes_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lists_data);
      return;
    }
    iVar7 = iVar8;
    if ((lists_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(lists_data.sel)->sel_vector[iVar8];
    }
    iVar10 = iVar8;
    if ((new_sizes_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar10 = (idx_t)(new_sizes_data.sel)->sel_vector[iVar8];
    }
    if ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6] >>
         (iVar7 & 0x3f) & 1) != 0)) {
      if ((new_sizes_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((new_sizes_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
           [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0)) {
        uVar9 = *(ulong *)(new_sizes_data.data + iVar10 * 8);
      }
      else {
        uVar9 = 0;
      }
      uVar2 = *(ulong *)(lists_data.data + iVar7 * 0x10 + 8);
      uVar6 = uVar9;
      if (uVar2 < uVar9) {
        uVar6 = uVar2;
      }
      *(idx_t *)(pdVar1 + iVar8 * 0x10) = iVar5;
      *(ulong *)(pdVar1 + iVar8 * 0x10 + 8) = uVar9;
      VectorOperations::Copy
                (this_01,target,*(idx_t *)(lists_data.data + iVar7 * 0x10) + uVar6,
                 *(idx_t *)(lists_data.data + iVar7 * 0x10),iVar5);
      iVar7 = iVar5 + uVar6;
      if (uVar2 < uVar9) {
        iVar10 = uVar9 - uVar6;
        if (default_vector.ptr != (Vector *)0x0) {
          iVar4 = iVar8;
          if ((default_data.sel)->sel_vector != (sel_t *)0x0) {
            iVar4 = (idx_t)(default_data.sel)->sel_vector[iVar8];
          }
          if ((default_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((default_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar4 >> 6] >> (iVar4 & 0x3f) & 1) != 0)) {
            SelectionVector::SelectionVector(&sel,iVar10);
            for (iVar4 = 0; iVar10 != iVar4; iVar4 = iVar4 + 1) {
              sel.sel_vector[iVar4] = (sel_t)iVar8;
            }
            pVVar3 = optional_ptr<duckdb::Vector,_true>::operator*(&default_vector);
            VectorOperations::Copy(pVVar3,target,&sel,iVar10,0,iVar7);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&sel.selection_data.internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            iVar7 = iVar5 + uVar9;
            goto LAB_01490956;
          }
        }
        while (bVar11 = iVar10 != 0, iVar10 = iVar10 - 1, bVar11) {
          FlatVector::SetNull(target,iVar7,true);
          iVar7 = iVar7 + 1;
        }
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar8);
      iVar7 = iVar5;
    }
LAB_01490956:
    iVar8 = iVar8 + 1;
    iVar5 = iVar7;
  } while( true );
}

Assistant:

void ListResizeFunction(DataChunk &args, ExpressionState &, Vector &result) {

	// Early-out, if the return value is a constant NULL.
	if (result.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	auto &lists = args.data[0];
	auto &new_sizes = args.data[1];
	auto row_count = args.size();

	UnifiedVectorFormat lists_data;
	lists.ToUnifiedFormat(row_count, lists_data);
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(lists_data);

	auto &child_vector = ListVector::GetEntry(lists);
	UnifiedVectorFormat child_data;
	child_vector.ToUnifiedFormat(row_count, child_data);

	UnifiedVectorFormat new_sizes_data;
	new_sizes.ToUnifiedFormat(row_count, new_sizes_data);
	D_ASSERT(new_sizes.GetType().id() == LogicalTypeId::UBIGINT);
	auto new_size_entries = UnifiedVectorFormat::GetData<uint64_t>(new_sizes_data);

	// Get the new size of the result child vector.
	// We skip rows with NULL values in the input lists.
	idx_t child_vector_size = 0;
	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {
		auto list_idx = lists_data.sel->get_index(row_idx);
		auto new_size_idx = new_sizes_data.sel->get_index(row_idx);

		if (lists_data.validity.RowIsValid(list_idx) && new_sizes_data.validity.RowIsValid(new_size_idx)) {
			child_vector_size += new_size_entries[new_size_idx];
		}
	}
	ListVector::Reserve(result, child_vector_size);
	ListVector::SetListSize(result, child_vector_size);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_entries = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	auto &result_child_vector = ListVector::GetEntry(result);

	// Get the default values, if provided.
	UnifiedVectorFormat default_data;
	optional_ptr<Vector> default_vector;
	if (args.ColumnCount() == 3) {
		default_vector = &args.data[2];
		default_vector->ToUnifiedFormat(row_count, default_data);
	}

	idx_t offset = 0;
	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {

		auto list_idx = lists_data.sel->get_index(row_idx);
		auto new_size_idx = new_sizes_data.sel->get_index(row_idx);

		// Set to NULL, if the list is NULL.
		if (!lists_data.validity.RowIsValid(list_idx)) {
			result_validity.SetInvalid(row_idx);
			continue;
		}

		idx_t new_size = 0;
		if (new_sizes_data.validity.RowIsValid(new_size_idx)) {
			new_size = new_size_entries[new_size_idx];
		}

		// If new_size >= length, then we copy [0, length) values.
		// If new_size < length, then we copy [0, new_size) values.
		auto copy_count = MinValue<idx_t>(list_entries[list_idx].length, new_size);

		// Set the result entry.
		result_entries[row_idx].offset = offset;
		result_entries[row_idx].length = new_size;

		// Copy the child vector's values.
		// The number of elements to copy is later determined like so: source_count - source_offset.
		idx_t source_offset = list_entries[list_idx].offset;
		idx_t source_count = source_offset + copy_count;
		VectorOperations::Copy(child_vector, result_child_vector, source_count, source_offset, offset);
		offset += copy_count;

		// Fill the remaining space with the default values.
		if (copy_count < new_size) {
			idx_t remaining_count = new_size - copy_count;

			if (default_vector) {
				auto default_idx = default_data.sel->get_index(row_idx);
				if (default_data.validity.RowIsValid(default_idx)) {
					SelectionVector sel(remaining_count);
					for (idx_t j = 0; j < remaining_count; j++) {
						sel.set_index(j, row_idx);
					}
					VectorOperations::Copy(*default_vector, result_child_vector, sel, remaining_count, 0, offset);
					offset += remaining_count;
					continue;
				}
			}

			// Fill the remaining space with NULL.
			for (idx_t j = copy_count; j < new_size; j++) {
				FlatVector::SetNull(result_child_vector, offset, true);
				offset++;
			}
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}